

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int bIncrRowid)

{
  Vdbe *p;
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  int iEnd;
  VdbeOp *pOp;
  Vdbe *v;
  VdbeOp *local_28;
  int local_c;
  
  p = (Vdbe *)in_RDI[2];
  local_28 = sqlite3VdbeGetOp(p,in_ESI);
  iVar1 = sqlite3VdbeCurrentAddr(p);
  local_c = in_ESI;
  if (*(char *)(*in_RDI + 0x61) == '\0') {
    for (; local_c < iVar1; local_c = local_c + 1) {
      if (local_28->p1 == in_EDX) {
        if (local_28->opcode == 'Z') {
          local_28->opcode = 'N';
          local_28->p1 = local_28->p2 + in_ECX;
          local_28->p2 = local_28->p3;
          local_28->p3 = 0;
        }
        else if (local_28->opcode == 0x81) {
          if (in_R8D == 0) {
            local_28->opcode = 'I';
            local_28->p1 = 0;
            local_28->p3 = 0;
          }
          else {
            local_28->opcode = 'S';
            local_28->p1 = local_28->p2;
            local_28->p2 = 1;
          }
        }
      }
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int bIncrRowid      /* If non-zero, transform OP_rowid to OP_AddImm(1) */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
    }else if( pOp->opcode==OP_Rowid ){
      if( bIncrRowid ){
        /* Increment the value stored in the P2 operand of the OP_Rowid. */
        pOp->opcode = OP_AddImm;
        pOp->p1 = pOp->p2;
        pOp->p2 = 1;
      }else{
        pOp->opcode = OP_Null;
        pOp->p1 = 0;
        pOp->p3 = 0;
      }
    }
  }
}